

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_app.h
# Opt level: O1

char * sapp_get_clipboard_string(void)

{
  if (_sapp.clipboard.enabled) {
    return _sapp.clipboard.buffer;
  }
  return "";
}

Assistant:

SOKOL_API_IMPL const char* sapp_get_clipboard_string(void) {
    if (!_sapp.clipboard.enabled) {
        return "";
    }
    #if defined(_SAPP_MACOS)
        return _sapp_macos_get_clipboard_string();
    #elif defined(_SAPP_EMSCRIPTEN)
        return _sapp.clipboard.buffer;
    #elif defined(_SAPP_WIN32)
        return _sapp_win32_get_clipboard_string();
    #else
        /* not implemented */
        return _sapp.clipboard.buffer;
    #endif
}